

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O3

bool __thiscall
icu_63::number::impl::PropertiesAffixPatternProvider::hasCurrencySign
          (PropertiesAffixPatternProvider *this)

{
  UErrorCode *status;
  bool bVar1;
  bool bVar2;
  ErrorCode localStatus;
  ErrorCode local_28;
  
  status = &local_28.errorCode;
  local_28._vptr_ErrorCode = (_func_int **)&PTR__ErrorCode_003b4910;
  local_28.errorCode = U_ZERO_ERROR;
  bVar1 = AffixUtils::hasCurrencySymbols(&this->posPrefix,status);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = AffixUtils::hasCurrencySymbols(&this->posSuffix,status);
    if (!bVar1) {
      bVar1 = AffixUtils::hasCurrencySymbols(&this->negPrefix,status);
      if (!bVar1) {
        bVar2 = AffixUtils::hasCurrencySymbols(&this->negSuffix,status);
      }
    }
  }
  ErrorCode::~ErrorCode(&local_28);
  return bVar2;
}

Assistant:

bool PropertiesAffixPatternProvider::hasCurrencySign() const {
    ErrorCode localStatus;
    return AffixUtils::hasCurrencySymbols(posPrefix, localStatus) ||
           AffixUtils::hasCurrencySymbols(posSuffix, localStatus) ||
           AffixUtils::hasCurrencySymbols(negPrefix, localStatus) ||
           AffixUtils::hasCurrencySymbols(negSuffix, localStatus);
}